

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkUtil.c
# Opt level: O2

void Nwk_ManMinimumBaseRec(Nwk_Man_t *pNtk,int fVerbose)

{
  int iVar1;
  abctime aVar2;
  abctime aVar3;
  int level;
  Nwk_Man_t *pNVar4;
  
  aVar2 = Abc_Clock();
  do {
    pNVar4 = pNtk;
    iVar1 = Nwk_ManMinimumBaseInt(pNtk,fVerbose);
    level = (int)pNVar4;
  } while (iVar1 != 0);
  Abc_Print(level,"%s =","Minbase");
  aVar3 = Abc_Clock();
  Abc_Print(level,"%9.2f sec\n",(double)(aVar3 - aVar2) / 1000000.0);
  return;
}

Assistant:

void Nwk_ManMinimumBaseRec( Nwk_Man_t * pNtk, int fVerbose )
{
    int i;
    abctime clk = Abc_Clock();
    for ( i = 0; Nwk_ManMinimumBaseInt( pNtk, fVerbose ); i++ );
    ABC_PRT( "Minbase", Abc_Clock() - clk );
}